

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

void ImPlot::SetNextPlotTicksY
               (double y_min,double y_max,int n_ticks,char **labels,bool show_default,
               ImPlotYAxis y_axis)

{
  int iVar1;
  double *values;
  ImPlotYAxis y_axis_local;
  bool show_default_local;
  char **labels_local;
  int n_ticks_local;
  double y_max_local;
  double y_min_local;
  
  if (n_ticks < 2) {
    __assert_fail("(n_ticks > 1) && \"The number of ticks must be greater than 1\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xa3e,
                  "void ImPlot::SetNextPlotTicksY(double, double, int, const char *const *, bool, ImPlotYAxis)"
                 );
  }
  if ((SetNextPlotTicksY(double,double,int,char_const**,bool,int)::buffer == '\0') &&
     (iVar1 = __cxa_guard_acquire(&SetNextPlotTicksY(double,double,int,char_const**,bool,int)::
                                   buffer), iVar1 != 0)) {
    ImVector<double>::ImVector(&SetNextPlotTicksY::buffer);
    __cxa_atexit(ImVector<double>::~ImVector,&SetNextPlotTicksY::buffer,&__dso_handle);
    __cxa_guard_release(&SetNextPlotTicksY(double,double,int,char_const**,bool,int)::buffer);
  }
  FillRange<double>(&SetNextPlotTicksY::buffer,n_ticks,y_min,y_max);
  values = ImVector<double>::operator[](&SetNextPlotTicksY::buffer,0);
  SetNextPlotTicksY(values,n_ticks,labels,show_default,y_axis);
  return;
}

Assistant:

void SetNextPlotTicksY(double y_min, double y_max, int n_ticks, const char* const labels[], bool show_default, ImPlotYAxis y_axis) {
    IM_ASSERT_USER_ERROR(n_ticks > 1, "The number of ticks must be greater than 1");
    static ImVector<double> buffer;
    FillRange(buffer, n_ticks, y_min, y_max);
    SetNextPlotTicksY(&buffer[0], n_ticks, labels, show_default,y_axis);
}